

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger thread_getstackinfos(HSQUIRRELVM v)

{
  SQObjectPtr *o_00;
  HSQUIRRELVM dest;
  HSQUIRRELVM pSVar1;
  SQRESULT res;
  SQInteger level;
  SQInteger threadtop;
  SQVM *thread;
  SQObjectPtr o;
  SQChar *in_stack_ffffffffffffff88;
  HSQUIRRELVM in_stack_ffffffffffffff90;
  SQInteger *in_stack_ffffffffffffff98;
  HSQUIRRELVM src;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  SQInteger in_stack_ffffffffffffffc0;
  HSQUIRRELVM in_stack_ffffffffffffffc8;
  SQObjectPtr local_20;
  HSQUIRRELVM local_8;
  
  o_00 = stack_get(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
  SQObjectPtr::SQObjectPtr(&local_20,o_00);
  if (local_20.super_SQObject._type == OT_THREAD) {
    dest = (HSQUIRRELVM)sq_gettop((HSQUIRRELVM)local_20.super_SQObject._unVal.pTable);
    sq_getinteger((HSQUIRRELVM)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                  (SQInteger)dest,in_stack_ffffffffffffff98);
    pSVar1 = (HSQUIRRELVM)__getcallstackinfos(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    src = pSVar1;
    if ((long)pSVar1 < 0) {
      sq_settop(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
      if (((local_20.super_SQObject._unVal.pNativeClosure)->_name).super_SQObject._type == OT_STRING
         ) {
        sq_throwerror(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else {
        sq_throwerror(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
    if ((long)pSVar1 < 1) {
      sq_settop(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
      local_8 = (HSQUIRRELVM)0x0;
    }
    else {
      sq_move(dest,src,(SQInteger)in_stack_ffffffffffffff90);
      sq_settop(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
      local_8 = (HSQUIRRELVM)0x1;
    }
  }
  else {
    in_stack_ffffffffffffff90 =
         (HSQUIRRELVM)sq_throwerror(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_8 = in_stack_ffffffffffffff90;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
  return (SQInteger)local_8;
}

Assistant:

static SQInteger thread_getstackinfos(HSQUIRRELVM v)
{
    SQObjectPtr o = stack_get(v,1);
    if(type(o) == OT_THREAD) {
        SQVM *thread = _thread(o);
        SQInteger threadtop = sq_gettop(thread);
        SQInteger level;
        sq_getinteger(v,-1,&level);
        SQRESULT res = __getcallstackinfos(thread,level);
        if(SQ_FAILED(res))
        {
            sq_settop(thread,threadtop);
            if(type(thread->_lasterror) == OT_STRING) {
                sq_throwerror(v,_stringval(thread->_lasterror));
            }
            else {
                sq_throwerror(v,_SC("unknown error"));
            }
        }
        if(res > 0) {
            //some result
            sq_move(v,thread,-1);
            sq_settop(thread,threadtop);
            return 1;
        }
        //no result
        sq_settop(thread,threadtop);
        return 0;

    }
    return sq_throwerror(v,_SC("wrong parameter"));
}